

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O3

_Bool gen_iblock(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar2;
  void *__ptr_02;
  undefined8 uVar3;
  _Bool _Var4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  if (n_ESIs < K) {
    _Var4 = false;
    fprintf(_stderr,"Error:  Insufficient number of Symbols.\n        K=%d, #ESIs=%d\n",
            (ulong)(uint)K,(ulong)(uint)n_ESIs);
  }
  else {
    uVar1 = RqInterGetMemSizes(K,n_ESIs - K,&local_38,&local_48,&local_40);
    if (uVar1 == 0) {
      __ptr = malloc(local_38);
      __ptr_00 = malloc(local_48);
      uVar1 = RqInterInit(K,n_ESIs - K,__ptr,local_38);
      if (uVar1 == 0) {
        if (0 < n_ESIs) {
          uVar7 = 0;
          do {
            uVar1 = RqInterAddIds(__ptr,ESIs[uVar7],1);
            if (uVar1 != 0) {
              pcVar6 = "RqInterAddIds(wrk, ESIs[i], 1)";
              uVar3 = 0x4f;
              goto LAB_00101639;
            }
            uVar7 = uVar7 + 1;
          } while ((uint)n_ESIs != uVar7);
        }
        uVar1 = RqInterCompile(__ptr,__ptr_00,local_48);
        if (uVar1 == 0) {
          lVar5 = (long)T;
          sVar8 = n_ESIs * lVar5;
          __ptr_01 = malloc(sVar8);
          sVar2 = fread(__ptr_01,1,sVar8,_stdin);
          if (sVar2 == sVar8) {
            sVar2 = local_40 * lVar5;
            __ptr_02 = malloc(sVar2);
            uVar1 = RqInterExecute(__ptr_00,lVar5,__ptr_01,sVar8,__ptr_02,sVar2);
            if (uVar1 == 0) {
              sVar8 = fwrite(__ptr_02,1,sVar2,_stdout);
              _Var4 = true;
              if (sVar8 != sVar2) {
                gen_iblock_cold_2();
                _Var4 = false;
              }
            }
            else {
              _Var4 = false;
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x5e,"RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz)",
                      (ulong)uVar1);
            }
            if (__ptr_02 != (void *)0x0) {
              free(__ptr_02);
            }
          }
          else {
            gen_iblock_cold_1();
            _Var4 = false;
          }
          if (__ptr_01 != (void *)0x0) {
            free(__ptr_01);
          }
        }
        else {
          _Var4 = false;
          fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                  ,0x50,"RqInterCompile(wrk, prog, prog_sz)",(ulong)uVar1);
        }
      }
      else {
        pcVar6 = "RqInterInit(K, nExtra, wrk, work_sz)";
        uVar3 = 0x4d;
LAB_00101639:
        _Var4 = false;
        fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                ,uVar3,pcVar6,(ulong)uVar1);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    }
    else {
      _Var4 = false;
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,0x49,"RqInterGetMemSizes(K, nExtra, &work_sz, &prog_sz, &inter_sym_num)",(ulong)uVar1
             );
    }
  }
  return _Var4;
}

Assistant:

bool gen_iblock(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqInterWorkMem* wrk = NULL;
	RqInterProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	if (n_ESIs < K) {
		fprintf(stderr, "Error:  Insufficient number of Symbols.\n"
		                "        K=%d, #ESIs=%d\n", K, n_ESIs);
		goto xit;
	}

	int nExtra = n_ESIs - K;
	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K,
				nExtra,
				&work_sz,
				&prog_sz,
				&inter_sym_num), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqInterInit(K, nExtra, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqInterAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqInterCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)n_ESIs;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = inter_sym_num * T;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	/* Done */
	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}